

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O0

void ZXing::QRCode::EmbedPositionDetectionPattern(int xStart,int yStart,TritMatrix *matrix)

{
  PointT<int> p;
  int iVar1;
  int iVar2;
  Matrix<ZXing::Trit> *in_RDX;
  int in_EDI;
  int i;
  anon_class_8_1_60b188ff setIfInside;
  int x;
  int y;
  Matrix<ZXing::Trit> *this;
  int in_stack_ffffffffffffffb0;
  value_t value;
  int local_44;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  anon_class_8_1_60b188ff *in_stack_ffffffffffffffd0;
  Trit local_19;
  int local_18;
  int local_14;
  Matrix<ZXing::Trit> *local_10;
  int local_4;
  
  local_10 = in_RDX;
  local_4 = in_EDI;
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
      iVar1 = local_4 + local_18;
      this = local_10;
      PointT<int>::PointT((PointT<int> *)&stack0xffffffffffffffd4,local_18,local_14);
      PointT<int>::PointT((PointT<int> *)&stack0xffffffffffffffcc,3,3);
      operator-<int,_int>((PointT<int> *)this,(PointT<int> *)0x303b6a);
      p.y = iVar1;
      p.x = in_stack_ffffffffffffffb0;
      iVar2 = maxAbsComponent<int>(p);
      value.value = (value_t)((uint)iVar1 >> 0x18);
      Trit::Trit(&local_19,iVar2 != 2);
      Matrix<ZXing::Trit>::set(this,0,0x303ba5,value);
    }
  }
  for (local_44 = -1; local_44 < 8; local_44 = local_44 + 1) {
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void EmbedPositionDetectionPattern(int xStart, int yStart, TritMatrix& matrix)
{
	for (int y = 0; y < 7; ++y)
		for (int x = 0; x < 7; ++x)
			matrix.set(xStart + x, yStart + y, maxAbsComponent(PointI(x, y) - PointI(3, 3)) != 2);

	// Surround the 7x7 pattern with one line of white space (separation pattern)
	auto setIfInside = [&](int x, int y) {
		if( x >= 0 && x < matrix.width() && y >= 0 && y < matrix.height())
			matrix.set(x, y, 0);
	};

	for (int i = -1; i < 8; ++i) {
		setIfInside(xStart + i, yStart - 1); // top
		setIfInside(xStart + i, yStart + 7); // bottom
		setIfInside(xStart - 1, yStart + i); // left
		setIfInside(xStart + 7, yStart + i); // right
	}
}